

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

char_int_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
::get(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
      *this)

{
  int_type iVar1;
  value_type *__x;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  
  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + 1;
  *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
  if ((*(byte *)(in_RDI + 0x18) & 1) == 0) {
    iVar1 = input_stream_adapter::get_character
                      ((input_stream_adapter *)
                       CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
    *(int_type *)(in_RDI + 0x14) = iVar1;
  }
  else {
    *(undefined1 *)(in_RDI + 0x18) = 0;
  }
  iVar2 = *(int *)(in_RDI + 0x14);
  iVar1 = std::char_traits<char>::eof();
  if (iVar2 != iVar1) {
    __x = (value_type *)(in_RDI + 0x38);
    std::char_traits<char>::to_char_type((int_type *)(in_RDI + 0x14));
    std::vector<char,_std::allocator<char>_>::push_back
              ((vector<char,_std::allocator<char>_> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),__x)
    ;
  }
  if (*(int *)(in_RDI + 0x14) == 10) {
    *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
    *(undefined8 *)(in_RDI + 0x28) = 0;
  }
  return *(char_int_type *)(in_RDI + 0x14);
}

Assistant:

char_int_type get()
    {
        ++position.chars_read_total;
        ++position.chars_read_current_line;

        if (next_unget)
        {
            // just reset the next_unget variable and work with current
            next_unget = false;
        }
        else
        {
            current = ia.get_character();
        }

        if (JSON_HEDLEY_LIKELY(current != std::char_traits<char_type>::eof()))
        {
            token_string.push_back(std::char_traits<char_type>::to_char_type(current));
        }

        if (current == '\n')
        {
            ++position.lines_read;
            position.chars_read_current_line = 0;
        }

        return current;
    }